

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRefs.c
# Opt level: O2

void Abc_NodeMffcLabel_rec(Abc_Obj_t *pNode,int fTopmost,Vec_Ptr_t *vNodes)

{
  int iVar1;
  uint uVar2;
  long lVar3;
  
  if (((fTopmost != 0) ||
      (((uVar2 = *(uint *)&pNode->field_0x14 & 0xf, uVar2 != 2 && (uVar2 != 5)) &&
       ((pNode->vFanouts).nSize < 1)))) && (iVar1 = Abc_NodeIsTravIdCurrent(pNode), iVar1 == 0)) {
    Abc_NodeSetTravIdCurrent(pNode);
    for (lVar3 = 0; lVar3 < (pNode->vFanins).nSize; lVar3 = lVar3 + 1) {
      Abc_NodeMffcLabel_rec
                ((Abc_Obj_t *)pNode->pNtk->vObjs->pArray[(pNode->vFanins).pArray[lVar3]],0,vNodes);
    }
    if (vNodes != (Vec_Ptr_t *)0x0) {
      Vec_PtrPush(vNodes,pNode);
      return;
    }
  }
  return;
}

Assistant:

void Abc_NodeMffcLabel_rec( Abc_Obj_t * pNode, int fTopmost, Vec_Ptr_t * vNodes )
{
    Abc_Obj_t * pFanin;
    int i;
    // add to the new support nodes
    if ( !fTopmost && (Abc_ObjIsCi(pNode) || pNode->vFanouts.nSize > 0) )
        return;
    // skip visited nodes
    if ( Abc_NodeIsTravIdCurrent(pNode) )
        return;
    Abc_NodeSetTravIdCurrent(pNode);
    // recur on the children
    Abc_ObjForEachFanin( pNode, pFanin, i )
        Abc_NodeMffcLabel_rec( pFanin, 0, vNodes );
    // collect the internal node
//    printf( "%d ", pNode->Id );
    if ( vNodes )
        Vec_PtrPush( vNodes, pNode );
}